

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffptdmll(fitsfile *fptr,int colnum,int naxis,LONGLONG *naxes,int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  tcolumn *colptr;
  LONGLONG repeat;
  LONGLONG totalpix;
  char local_1d8 [4];
  int ii;
  char message [81];
  char local_178 [8];
  char value [80];
  char comm [73];
  char tdimstr [71];
  char local_88 [8];
  char keyname [75];
  int *status_local;
  LONGLONG *naxes_local;
  int naxis_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  repeat = 1;
  if (*status < 1) {
    if ((colnum < 1) || (999 < colnum)) {
      ffpmsg("column number is out of range 1 - 999 (ffptdm)");
      *status = 0x12e;
      fptr_local._4_4_ = 0x12e;
    }
    else if (naxis < 1) {
      ffpmsg("naxis is less than 1 (ffptdm)");
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
    else {
      if (fptr->HDUposition == fptr->Fptr->curhdu) {
        if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
          return *status;
        }
      }
      else {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      if (fptr->Fptr->hdutype == 2) {
        strcpy(comm + 0x48,"(");
        for (totalpix._4_4_ = 0; totalpix._4_4_ < naxis; totalpix._4_4_ = totalpix._4_4_ + 1) {
          if (0 < totalpix._4_4_) {
            strcat(comm + 0x48,",");
          }
          if (naxes[totalpix._4_4_] < 0) {
            ffpmsg("one or more TDIM values are less than 0 (ffptdm)");
            *status = 0x107;
            return 0x107;
          }
          snprintf(local_178,0x50,"%.0f",(double)naxes[totalpix._4_4_]);
          sVar3 = strlen(comm + 0x48);
          sVar4 = strlen(local_178);
          if (0x46 < sVar3 + sVar4 + 1) {
            ffpmsg("TDIM string too long (ffptdmll)");
            *status = 0x107;
            return 0x107;
          }
          strcat(comm + 0x48,local_178);
          repeat = naxes[totalpix._4_4_] * repeat;
        }
        ptVar1 = fptr->Fptr->tableptr;
        if (ptVar1[colnum + -1].trepeat != repeat) {
          ffkeyn("TFORM",colnum,local_88,status);
          ffgkys(fptr,local_88,local_178,(char *)0x0,status);
          ffbnfmll(local_178,(int *)0x0,(LONGLONG *)&colptr,(long *)0x0,status);
          if ((0 < *status) || (colptr != (tcolumn *)repeat)) {
            snprintf(local_1d8,0x51,
                     "column vector length, %.0f, does not equal TDIMn array size, %.0f",
                     (double)ptVar1[colnum + -1].trepeat,(double)repeat);
            ffpmsg(local_1d8);
            *status = 0x107;
            return 0x107;
          }
        }
        strcat(comm + 0x48,")");
        strcpy(value + 0x48,"size of the multidimensional array");
        ffkeyn("TDIM",colnum,local_88,status);
        ffpkys(fptr,local_88,comm + 0x48,value + 0x48,status);
        fptr_local._4_4_ = *status;
      }
      else {
        ffpmsg("Error: The TDIMn keyword is only allowed in BINTABLE extensions (ffptdm)");
        *status = 0xe3;
        fptr_local._4_4_ = 0xe3;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffptdmll( fitsfile *fptr, /* I - FITS file pointer                      */
            int colnum,     /* I - column number                            */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[], /* I - length of each data axis               */
            int *status)    /* IO - error status                            */
/*
  write the TDIMnnn keyword describing the dimensionality of a column
*/
{
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE], comm[FLEN_COMMENT];
    char value[80], message[81];
    int ii;
    LONGLONG totalpix = 1, repeat;
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (colnum < 1 || colnum > 999)
    {
        ffpmsg("column number is out of range 1 - 999 (ffptdm)");
        return(*status = BAD_COL_NUM);
    }

    if (naxis < 1)
    {
        ffpmsg("naxis is less than 1 (ffptdm)");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ( (fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
    "Error: The TDIMn keyword is only allowed in BINTABLE extensions (ffptdm)");
       return(*status = NOT_BTABLE);
    }

    strcpy(tdimstr, "(");            /* start constructing the TDIM value */   

    for (ii = 0; ii < naxis; ii++)
    {
        if (ii > 0)
            strcat(tdimstr, ",");   /* append the comma separator */

        if (naxes[ii] < 0)
        {
            ffpmsg("one or more TDIM values are less than 0 (ffptdm)");
            return(*status = BAD_TDIM);
        }

        /* cast to double because the 64-bit int conversion character in */
        /* sprintf is platform dependent ( %lld, %ld, %I64d )            */

        snprintf(value, 80, "%.0f", (double) naxes[ii]);
        
        if (strlen(tdimstr)+strlen(value)+1 > FLEN_VALUE-1)
        {
            ffpmsg("TDIM string too long (ffptdmll)");
            return(*status = BAD_TDIM);
        }
        strcat(tdimstr, value);     /* append the axis size */

        totalpix *= naxes[ii];
    }

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);      /* point to the specified column number */

    if ( colptr->trepeat != totalpix)
    {
      /* There is an apparent inconsistency between TDIMn and TFORMn. */
      /* The colptr->trepeat value may be out of date, so re-read     */
      /* the TFORMn keyword to be sure.                               */

      ffkeyn("TFORM", colnum, keyname, status);   /* construct TFORMn name  */
      ffgkys(fptr, keyname, value, NULL, status); /* read TFORMn keyword    */
      ffbnfmll(value, NULL, &repeat, NULL, status); /* parse the repeat count */

      if (*status > 0 || repeat != totalpix)
      {
        snprintf(message,FLEN_ERRMSG,
        "column vector length, %.0f, does not equal TDIMn array size, %.0f",
        (double) (colptr->trepeat), (double) totalpix);
        ffpmsg(message);
        return(*status = BAD_TDIM);
      }
    }

    strcat(tdimstr, ")" );            /* append the closing parenthesis */

    strcpy(comm, "size of the multidimensional array");
    ffkeyn("TDIM", colnum, keyname, status);      /* construct TDIMn name */
    ffpkys(fptr, keyname, tdimstr, comm, status);  /* write the keyword */
    return(*status);
}